

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_rectangle_rounded_lines
               (rf_rec rec,float roundness,int segments,int line_thick,rf_color color)

{
  float fVar1;
  float fVar2;
  rf_render_batch *prVar3;
  rf_vertex_buffer *prVar4;
  uchar w;
  int iVar5;
  uchar z;
  long lVar6;
  ulong uVar7;
  uchar y;
  uchar x;
  rf_int k;
  long lVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float __x;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar16;
  float x_00;
  float fVar17;
  float fVar18;
  float y_00;
  rf_rec rec_00;
  float local_1d0;
  float local_128 [3];
  undefined8 local_11c;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  undefined8 local_b8;
  float local_b0;
  float local_ac;
  undefined8 local_a8;
  float local_a0;
  float local_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  long local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar17 = rec.width;
  fStack_d4 = rec.height;
  local_c8 = rec.x;
  fVar15 = rec.y;
  iVar9 = 0;
  if (0 < line_thick) {
    iVar9 = line_thick;
  }
  if (0.0 < roundness) {
    fVar18 = 1.0;
    if (roundness <= 1.0) {
      fVar18 = roundness;
    }
    fVar10 = fStack_d4;
    if (fVar17 <= fStack_d4) {
      fVar10 = fVar17;
    }
    fVar18 = fVar10 * fVar18 * 0.5;
    if (0.0 < fVar18) {
      if (segments < 4) {
        fVar10 = 1.0 - 0.5 / fVar18;
        fVar10 = fVar10 * fVar10;
        fVar10 = acosf(fVar10 + fVar10 + -1.0);
        fVar10 = ceilf(6.2831855 / fVar10);
        segments = 4;
        if (0 < (int)(fVar10 * 0.5)) {
          segments = (int)(fVar10 * 0.5);
        }
      }
      local_108 = (float)iVar9;
      fVar10 = fVar18 + local_108;
      fVar17 = fVar17 + local_c8;
      fStack_d4 = fStack_d4 + fVar15;
      x_00 = fVar17 - fVar18;
      local_104 = fStack_d4 - fVar18;
      fVar16 = fVar18 + local_c8;
      local_128[1] = fVar18 + fVar15;
      y_00 = fVar15 - local_108;
      local_128[0] = fVar17 + local_108;
      local_11c = CONCAT44(x_00,local_104);
      local_114 = fStack_d4 + local_108;
      local_108 = local_c8 - local_108;
      local_b8 = CONCAT44(local_128[1],fVar16);
      local_a8 = CONCAT44(local_104,x_00);
      prVar3 = (rf__ctx->field_0).current_batch;
      lVar8 = prVar3->current_buffer;
      prVar4 = prVar3->vertex_buffers;
      iVar9 = prVar4[lVar8].v_counter;
      iVar5 = prVar4[lVar8].elements_count * 4;
      z = color.b;
      y = color.g;
      x = color.r;
      local_1d0._0_1_ = color.a;
      w = local_1d0._0_1_;
      local_128[2] = local_128[0];
      local_110 = fVar16;
      local_10c = local_114;
      local_100 = local_108;
      local_fc = local_128[1];
      local_f8 = fVar16;
      local_f4 = fVar15;
      local_f0 = x_00;
      local_ec = fVar15;
      local_e8 = fVar17;
      local_e4 = local_128[1];
      local_e0 = fVar17;
      fStack_dc = local_104;
      fStack_d8 = x_00;
      local_d0 = fVar16;
      local_cc = fStack_d4;
      local_c4 = local_104;
      local_c0 = local_c8;
      local_bc = local_128[1];
      local_b0 = x_00;
      local_ac = local_128[1];
      local_a0 = fVar16;
      local_9c = local_104;
      if (line_thick < 2) {
        if (iVar5 <= iVar9 + segments * 8 + 8) {
          rf_gfx_draw();
        }
        rf_gfx_begin(RF_LINES);
        lVar8 = 0;
        do {
          if (0 < segments) {
            fVar15 = *(float *)(&local_b8 + lVar8);
            fVar17 = *(float *)((long)&local_b8 + lVar8 * 8 + 4);
            local_1d0 = (float)(&DAT_001781b0)[lVar8];
            lVar6 = (long)segments;
            do {
              rf_gfx_color4ub(x,y,z,w);
              fVar18 = sinf(local_1d0 * 0.017453292);
              fVar16 = cosf(local_1d0 * 0.017453292);
              rf_gfx_vertex3f(fVar18 * fVar10 + fVar15,fVar16 * fVar10 + fVar17,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              local_1d0 = local_1d0 + 90.0 / (float)segments;
              fVar18 = sinf(local_1d0 * 0.017453292);
              fVar16 = cosf(local_1d0 * 0.017453292);
              rf_gfx_vertex3f(fVar18 * fVar10 + fVar15,fVar16 * fVar10 + fVar17,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        uVar7 = 0xfffffffffffffffe;
        do {
          rf_gfx_color4ub(x,y,z,w);
          rf_gfx_vertex3f(local_128[uVar7 * 2],local_128[uVar7 * 2 + 1],
                          ((rf__ctx->field_0).current_batch)->current_depth);
          rf_gfx_vertex3f(local_128[uVar7 * 2 + 2],*(float *)(&local_11c + uVar7),
                          ((rf__ctx->field_0).current_batch)->current_depth);
          uVar7 = uVar7 + 2;
        } while (uVar7 < 6);
      }
      else {
        local_98 = local_104;
        fStack_94 = local_104;
        fStack_90 = local_104;
        fStack_8c = local_104;
        local_88 = local_128[1];
        fStack_84 = local_128[1];
        fStack_80 = local_128[1];
        fStack_7c = local_128[1];
        local_78 = local_128[0];
        fStack_74 = fStack_d4;
        fStack_70 = in_XMM1_Dc + in_XMM0_Dc;
        fStack_6c = in_XMM1_Dd + in_XMM0_Dd;
        local_68 = fStack_d4;
        fStack_64 = fStack_d4;
        fStack_60 = fStack_d4;
        fStack_5c = fStack_d4;
        local_48 = local_114;
        fStack_44 = fStack_d4;
        fStack_40 = fStack_d4;
        fStack_3c = fStack_d4;
        if (iVar5 <= iVar9 + segments * 0x18 + 0x18) {
          rf_gfx_draw();
        }
        rf_gfx_begin(RF_TRIANGLES);
        local_50 = (long)segments;
        lVar8 = 0;
        do {
          if (0 < segments) {
            fVar1 = *(float *)(&local_b8 + lVar8);
            fVar2 = *(float *)((long)&local_b8 + lVar8 * 8 + 4);
            fVar13 = (float)(&DAT_001781b0)[lVar8];
            lVar6 = local_50;
            do {
              rf_gfx_color4ub(x,y,z,local_1d0._0_1_);
              __x = fVar13 * 0.017453292;
              fVar11 = sinf(__x);
              fVar12 = cosf(__x);
              rf_gfx_vertex3f(fVar11 * fVar18 + fVar1,fVar12 * fVar18 + fVar2,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              fVar11 = sinf(__x);
              fVar12 = cosf(__x);
              rf_gfx_vertex3f(fVar11 * fVar10 + fVar1,fVar12 * fVar10 + fVar2,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              fVar13 = fVar13 + 90.0 / (float)segments;
              fVar11 = fVar13 * 0.017453292;
              fVar12 = sinf(fVar11);
              fVar14 = cosf(fVar11);
              rf_gfx_vertex3f(fVar12 * fVar18 + fVar1,fVar14 * fVar18 + fVar2,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              fVar12 = sinf(fVar11);
              fVar14 = cosf(fVar11);
              rf_gfx_vertex3f(fVar12 * fVar18 + fVar1,fVar14 * fVar18 + fVar2,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              fVar12 = sinf(__x);
              fVar14 = cosf(__x);
              rf_gfx_vertex3f(fVar12 * fVar10 + fVar1,fVar14 * fVar10 + fVar2,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              fVar12 = sinf(fVar11);
              fVar11 = cosf(fVar11);
              rf_gfx_vertex3f(fVar12 * fVar10 + fVar1,fVar11 * fVar10 + fVar2,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        rf_gfx_color4ub(x,y,z,local_1d0._0_1_);
        rf_gfx_vertex3f(fVar16,y_00,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(fVar16,fVar15,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(x_00,fVar15,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(x_00,y_00,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(fVar16,y_00,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(x_00,fVar15,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_color4ub(x,y,z,local_1d0._0_1_);
        rf_gfx_vertex3f(fVar17,local_88,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(fVar17,local_98,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_78,local_98,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_78,local_88,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(fVar17,local_88,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_78,local_98,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_color4ub(x,y,z,local_1d0._0_1_);
        rf_gfx_vertex3f(fVar16,local_68,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(fVar16,local_48,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(x_00,local_48,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(x_00,local_68,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(fVar16,local_68,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_11c._4_4_,local_114,((rf__ctx->field_0).current_batch)->current_depth)
        ;
        rf_gfx_color4ub(x,y,z,local_1d0._0_1_);
        fVar17 = local_fc;
        fVar15 = local_100;
        rf_gfx_vertex3f(local_100,local_fc,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_108,local_104,((rf__ctx->field_0).current_batch)->current_depth);
        fVar10 = local_c4;
        fVar18 = local_c8;
        rf_gfx_vertex3f(local_c8,local_c4,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_c0,local_bc,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(fVar15,fVar17,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(fVar18,fVar10,((rf__ctx->field_0).current_batch)->current_depth);
      }
      rf_gfx_end();
    }
    return;
  }
  rec_00.width = (float)(iVar9 * 2) + fVar17;
  rec_00.height = (float)(iVar9 * 2) + fStack_d4;
  rec_00.y = fVar15 - (float)iVar9;
  rec_00.x = local_c8 - (float)iVar9;
  rf_draw_rectangle_outline(rec_00,iVar9,color);
  return;
}

Assistant:

RF_API void rf_draw_rectangle_rounded_lines(rf_rec rec, float roundness, int segments, int line_thick, rf_color color)
{
    if (line_thick < 0) line_thick = 0;

    // Not a rounded rectangle
    if (roundness <= 0.0f)
    {
        rf_draw_rectangle_outline((rf_rec) {rec.x - line_thick, rec.y - line_thick, rec.width + 2 * line_thick, rec.height + 2 * line_thick}, line_thick, color);
        return;
    }

    if (roundness >= 1.0f) roundness = 1.0f;

    // Calculate corner radius
    float radius = (rec.width > rec.height)? (rec.height*roundness)/2 : (rec.width*roundness)/2;
    if (radius <= 0.0f) return;

    // Calculate number of segments to use for the corners
    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = ceilf(2 * RF_PI / th) / 2;
        if (segments <= 0) segments = 4;
    }

    float step_length = 90.0f/(float)segments;
    const float outer_radius = radius + (float)line_thick, inner_radius = radius;

    /*  Quick sketch to make sense of all of this (mark the 16 + 4(corner centers P16-19) points we'll use below)
     *  Not my best attempt at ASCII art, just preted it's rounded rectangle :)
     *     P0                     P1
     *        ====================
     *     // P8                P9 \
     *    //                        \
     *P7 // P15                  P10 \\ P2
        \\ P2
     *  ||   *P16             P17*    ||
     *  ||                            ||
     *  || P14                   P11  ||
     *P6 \\  *P19             P18*   // P3
     *    \\                        //
     *     \\ P13              P12 //
     *        ====================
     *     P5                     P4

     */
    const rf_vec2 point[16] =
            {
                    {(float)rec.x + inner_radius, rec.y - line_thick}, {(float)(rec.x + rec.width) - inner_radius, rec.y - line_thick}, { rec.x + rec.width + line_thick, (float)rec.y + inner_radius }, // PO, P1, P2
                    {rec.x + rec.width + line_thick, (float)(rec.y + rec.height) - inner_radius}, {(float)(rec.x + rec.width) - inner_radius, rec.y + rec.height + line_thick}, // P3, P4
                    {(float)rec.x + inner_radius, rec.y + rec.height + line_thick}, { rec.x - line_thick, (float)(rec.y + rec.height) - inner_radius}, {rec.x - line_thick, (float)rec.y + inner_radius}, // P5, P6, P7
                    {(float)rec.x + inner_radius, rec.y}, {(float)(rec.x + rec.width) - inner_radius, rec.y}, // P8, P9
                    { rec.x + rec.width, (float)rec.y + inner_radius }, {rec.x + rec.width, (float)(rec.y + rec.height) - inner_radius}, // P10, P11
                    {(float)(rec.x + rec.width) - inner_radius, rec.y + rec.height}, {(float)rec.x + inner_radius, rec.y + rec.height}, // P12, P13
                    { rec.x, (float)(rec.y + rec.height) - inner_radius}, {rec.x, (float)rec.y + inner_radius} // P14, P15
            };

    const rf_vec2 centers[4] =
            {
                    {(float)rec.x + inner_radius, (float)rec.y + inner_radius}, {(float)(rec.x + rec.width) - inner_radius, (float)rec.y + inner_radius}, // P16, P17
                    {(float)(rec.x + rec.width) - inner_radius, (float)(rec.y + rec.height) - inner_radius}, {(float)rec.x + inner_radius, (float)(rec.y + rec.height) - inner_radius} // P18, P19
            };

    const float angles[4] = { 180.0f, 90.0f, 0.0f, 270.0f };

    if (line_thick > 1)
    {
        if (rf_gfx_check_buffer_limit(4 * 6*segments + 4 * 6)) rf_gfx_draw(); // 4 corners with 6(2 * 3) vertices for each segment + 4 rectangles with 6 vertices each

        rf_gfx_begin(RF_TRIANGLES);

        // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
        for (rf_int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
        {
            float angle = angles[k];
            const rf_vec2 center = centers[k];

            for (rf_int i = 0; i < segments; i++)
            {
                rf_gfx_color4ub(color.r, color.g, color.b, color.a);

                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);

                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*outer_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*outer_radius);

                angle += step_length;
            }
        }

        // Upper rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[0].x, point[0].y);
        rf_gfx_vertex2f(point[8].x, point[8].y);
        rf_gfx_vertex2f(point[9].x, point[9].y);
        rf_gfx_vertex2f(point[1].x, point[1].y);
        rf_gfx_vertex2f(point[0].x, point[0].y);
        rf_gfx_vertex2f(point[9].x, point[9].y);

        // Right rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[10].x, point[10].y);
        rf_gfx_vertex2f(point[11].x, point[11].y);
        rf_gfx_vertex2f(point[3].x, point[3].y);
        rf_gfx_vertex2f(point[2].x, point[2].y);
        rf_gfx_vertex2f(point[10].x, point[10].y);
        rf_gfx_vertex2f(point[3].x, point[3].y);

        // Lower rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[13].x, point[13].y);
        rf_gfx_vertex2f(point[5].x, point[5].y);
        rf_gfx_vertex2f(point[4].x, point[4].y);
        rf_gfx_vertex2f(point[12].x, point[12].y);
        rf_gfx_vertex2f(point[13].x, point[13].y);
        rf_gfx_vertex2f(point[4].x, point[4].y);

        // Left rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[7].x, point[7].y);
        rf_gfx_vertex2f(point[6].x, point[6].y);
        rf_gfx_vertex2f(point[14].x, point[14].y);
        rf_gfx_vertex2f(point[15].x, point[15].y);
        rf_gfx_vertex2f(point[7].x, point[7].y);
        rf_gfx_vertex2f(point[14].x, point[14].y);
        rf_gfx_end();

    }
    else
    {
        // Use LINES to draw the outline
        if (rf_gfx_check_buffer_limit(8*segments + 4 * 2)) rf_gfx_draw(); // 4 corners with 2 vertices for each segment + 4 rectangles with 2 vertices each

        rf_gfx_begin(RF_LINES);

        // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
        for (rf_int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
        {
            float angle = angles[k];
            const rf_vec2 center = centers[k];

            for (rf_int i = 0; i < segments; i++)
            {
                rf_gfx_color4ub(color.r, color.g, color.b, color.a);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*outer_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*outer_radius);
                angle += step_length;
            }
        }
        // And now the remaining 4 lines
        for(int i = 0; i < 8; i += 2)
        {
            rf_gfx_color4ub(color.r, color.g, color.b, color.a);
            rf_gfx_vertex2f(point[i].x, point[i].y);
            rf_gfx_vertex2f(point[i + 1].x, point[i + 1].y);
        }
        rf_gfx_end();
    }
}